

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  nk_panel_type nVar7;
  undefined4 uVar8;
  nk_window *pnVar9;
  nk_panel *pnVar10;
  nk_window *pnVar11;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var12;
  nk_size nVar13;
  nk_size nVar14;
  nk_size nVar15;
  undefined1 auVar16 [16];
  nk_vec2 nVar17;
  nk_panel *pnVar18;
  int iVar19;
  nk_panel *pnVar20;
  long lVar21;
  void *pvVar22;
  uint *puVar23;
  undefined2 uVar24;
  nk_panel *pnVar25;
  nk_page_element *pe;
  nk_window *pnVar26;
  nk_context *in;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect cursor;
  nk_rect empty_east;
  nk_rect empty_west;
  nk_rect local_100;
  float local_f0;
  nk_flags local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  nk_rect local_98;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cd,"void nk_end(struct nk_context *)");
  }
  pnVar9 = ctx->current;
  if (pnVar9 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43ce,"void nk_end(struct nk_context *)");
  }
  pnVar10 = pnVar9->layout;
  if (pnVar10 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cf,"void nk_end(struct nk_context *)");
  }
  if ((pnVar10->type == NK_PANEL_WINDOW) && ((pnVar9->flags & 0x1000) != 0)) goto LAB_0012a48b;
  b = &pnVar9->buffer;
  in = (nk_context *)0x0;
  if ((pnVar10->flags & 0x800) == 0) {
    in = ctx;
  }
  if ((pnVar10->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
  }
  local_d8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.x);
  local_b8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.y);
  nVar17 = nk_panel_get_padding(&ctx->style,pnVar10->type);
  auVar16._8_4_ = extraout_XMM0_Dc;
  auVar16._0_4_ = nVar17.x;
  auVar16._4_4_ = nVar17.y;
  auVar16._12_4_ = extraout_XMM0_Dd;
  fVar30 = (pnVar10->row).height + pnVar10->at_y;
  pnVar10->at_y = fVar30;
  local_c8 = auVar16;
  if ((pnVar10->flags & 0x4400) == 0x400) {
    fVar32 = (pnVar10->bounds).y;
    if (fVar30 < (pnVar10->bounds).h + fVar32) {
      (pnVar10->bounds).h = fVar30 - fVar32;
    }
    local_c8._4_4_ = nVar17.y;
    rect.y = fVar32;
    rect.x = (pnVar9->bounds).x;
    rect.h = (float)local_c8._4_4_;
    rect.w = (pnVar9->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar10->border + (float)local_c8._0_4_;
    rect_00.y = (pnVar10->bounds).y;
    rect_00.x = (pnVar9->bounds).x;
    rect_00.h = (pnVar10->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar10->bounds).x + (pnVar10->bounds).w) - pnVar10->border;
    fVar30 = pnVar10->border + (float)local_c8._0_4_;
    if ((*pnVar10->offset_y == 0) && ((pnVar10->flags & 0x20) == 0)) {
      fVar30 = fVar30 + (float)local_d8._0_4_;
    }
    rect_01.y = (pnVar10->bounds).y;
    rect_01.h = (pnVar10->bounds).h;
    rect_01.w = fVar30;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if ((*pnVar10->offset_x != 0) && ((pnVar10->flags & 0x20) == 0)) {
      rect_02.y = (pnVar10->bounds).y + (pnVar10->bounds).h;
      rect_02.x = (pnVar9->bounds).x;
      rect_02.h = (float)local_b8._0_4_;
      rect_02.w = (pnVar9->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((pnVar10->flags & 0x4020) == 0) &&
     (pnVar9->scrollbar_hiding_timer <= 4.0 && pnVar9->scrollbar_hiding_timer != 4.0)) {
    local_100.x = 0.0;
    fVar30 = (pnVar10->bounds).y;
    scroll.x = (pnVar10->bounds).x + (pnVar10->bounds).w + (float)local_c8._0_4_;
    fVar32 = (pnVar10->bounds).h;
    uVar6 = *pnVar10->offset_y;
    fVar33 = pnVar10->at_y;
    if ((pnVar10->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar9 == ctx->active) {
        bVar29 = pnVar10->has_scrolling != 0;
      }
      else {
        bVar29 = false;
      }
      if ((in == (nk_context *)0x0) || ((0.0 < (in->input).mouse.scroll_delta & bVar29) != 1)) {
        pnVar9->scrolled = 0;
      }
      else {
        pnVar9->scrolled = 1;
      }
    }
    else {
      pnVar20 = pnVar9->layout;
      pnVar18 = pnVar20;
      do {
        pnVar25 = pnVar18;
        pnVar18 = pnVar25->parent;
        pnVar11 = pnVar9;
      } while (pnVar25->parent != (nk_panel *)0x0);
      do {
        pnVar26 = pnVar11;
        pnVar11 = pnVar26->parent;
      } while (pnVar11 != (nk_window *)0x0);
      if (((pnVar26 == ctx->active) && (pnVar10->has_scrolling != 0)) && (in != (nk_context *)0x0))
      {
        uVar2 = (pnVar10->bounds).x;
        uVar4 = (pnVar10->bounds).y;
        fVar31 = (in->input).mouse.pos.x;
        bVar29 = false;
        if (((float)uVar2 <= fVar31) &&
           (uVar3 = (pnVar10->bounds).w, uVar5 = (pnVar10->bounds).h,
           fVar31 <= (float)uVar2 + (float)uVar3)) {
          fVar31 = (in->input).mouse.pos.y;
          bVar29 = false;
          if (((float)uVar4 <= fVar31) && (fVar31 <= (float)uVar4 + (float)uVar5)) {
            fVar31 = (pnVar25->clip).x;
            fVar36 = (pnVar10->bounds).x;
            if (((((pnVar10->bounds).w + fVar36 < fVar31) || (fVar31 + (pnVar25->clip).w < fVar36))
                || (fVar31 = (pnVar25->clip).y, fVar32 + fVar30 < fVar31)) ||
               (fVar31 + (pnVar25->clip).h < fVar30)) goto LAB_0012984e;
            for (; pnVar20->parent != (nk_panel *)0x0; pnVar20 = pnVar20->parent) {
              pnVar20->has_scrolling = 0;
            }
            pnVar20->has_scrolling = 0;
            bVar29 = true;
          }
        }
      }
      else {
LAB_0012984e:
        bVar29 = false;
      }
    }
    scroll.y = fVar30;
    scroll.h = fVar32;
    scroll.w = (float)local_d8._0_4_;
    fVar30 = nk_do_scrollbarv((nk_flags *)&local_100,b,scroll,(uint)bVar29,(float)uVar6,
                              (float)(int)(fVar33 - fVar30),fVar32 * 0.1,fVar32 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar10->offset_y = (nk_uint)(long)fVar30;
    if ((in != (nk_context *)0x0) && (bVar29 != false)) {
      (in->input).mouse.scroll_delta = 0.0;
    }
    local_ec = 0;
    local_100.y = (pnVar10->bounds).y + (pnVar10->bounds).h;
    fVar30 = (pnVar10->bounds).x;
    fVar32 = pnVar10->max_x;
    fVar33 = (pnVar10->bounds).w;
    fVar31 = (float)(int)(fVar32 - fVar30);
    font = (ctx->style).font;
    fVar36 = 1.0;
    if (1.0 <= (float)local_b8._0_4_) {
      fVar36 = (float)local_b8._0_4_;
    }
    fVar35 = fVar36 + fVar36;
    local_100.w = fVar35;
    if (fVar35 <= fVar33) {
      local_100.w = fVar33;
    }
    fVar33 = 0.0;
    local_100.x = fVar30;
    local_100.h = fVar36;
    if (local_100.w < fVar31) {
      fVar34 = (float)*pnVar10->offset_x;
      fVar33 = fVar32 * 0.05;
      local_e8 = ZEXT416((uint)fVar31);
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_a8 = ZEXT416((uint)fVar35);
        local_68 = ZEXT416((uint)local_100.w);
        local_f0 = fVar33;
        if (fVar32 * 0.005 <= fVar33) {
          local_f0 = fVar32 * 0.005;
        }
        bounds.y = local_100.y;
        bounds.x = fVar30;
        local_88 = ZEXT416((uint)local_100.y);
        bounds.h = fVar36;
        bounds.w = fVar36;
        local_78 = fVar36;
        fStack_74 = fVar36;
        fStack_70 = fVar36;
        fStack_6c = fVar36;
        iVar19 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar32 = 0.0;
        if (iVar19 != 0) {
          fVar32 = local_f0;
        }
        local_a8._4_4_ = local_68._4_4_;
        local_a8._0_4_ = (float)local_68._0_4_ - (float)local_a8._0_4_;
        local_a8._8_4_ = local_68._8_4_;
        local_a8._12_4_ = local_68._12_4_;
        fVar34 = fVar34 - fVar32;
        bounds_00.x = ((float)local_68._0_4_ + fVar30) - fVar36;
        bounds_00.h = fStack_74;
        bounds_00.w = local_78;
        bounds_00.y = (float)local_88._0_4_;
        iVar19 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar19 != 0) {
          fVar34 = fVar34 + local_f0;
        }
        local_100.x = fVar30 + fVar36;
        local_100.w = (float)local_a8._0_4_;
        fVar31 = (float)local_e8._0_4_;
      }
      fVar32 = local_100.w;
      fVar30 = local_100.x;
      if (local_100.w <= fVar33) {
        fVar33 = local_100.w;
      }
      if (fVar31 - local_100.w <= fVar34) {
        fVar34 = fVar31 - local_100.w;
      }
      fVar35 = 0.0;
      if (0.0 <= fVar34) {
        fVar35 = fVar34;
      }
      fVar34 = (ctx->style).scrollh.border;
      fVar1 = (ctx->style).scrollh.padding.x;
      local_98.x = (fVar35 / fVar31) * local_100.w + local_100.x + fVar34 + fVar1;
      local_98.w = (local_100.w / fVar31) * local_100.w - (fVar1 + fVar1 + fVar34 + fVar34);
      fVar1 = (ctx->style).scrollh.padding.y;
      local_98.y = fVar34 + local_100.y + fVar1;
      local_98.h = fVar36 - (fVar1 + fVar1 + fVar34 + fVar34);
      local_40.x = local_100.x;
      local_40.y = local_100.y;
      local_50.x = local_98.w + local_98.x;
      local_40.w = local_98.x - local_100.x;
      local_50.y = local_100.y;
      local_50.w = (local_100.w + local_100.x) - local_50.x;
      local_50.h = fVar36;
      local_40.h = fVar36;
      fVar33 = nk_scrollbar_behavior
                         (&local_ec,&in->input,0,&local_100,&local_98,&local_40,&local_50,fVar35,
                          fVar31,fVar33,NK_HORIZONTAL);
      local_98.x = (fVar33 / (float)local_e8._0_4_) * fVar32 + fVar30;
      p_Var12 = (ctx->style).scrollh.draw_begin;
      if (p_Var12 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var12)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_ec,&(ctx->style).scrollh,&local_100,&local_98);
      p_Var12 = (ctx->style).scrollh.draw_end;
      if (p_Var12 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var12)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar10->offset_x = (nk_uint)(long)fVar33;
  }
  if ((pnVar9->flags & 0x80) == 0) {
LAB_00129da8:
    pnVar9->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar30 = (ctx->input).mouse.delta.x;
    if ((((fVar30 != 0.0) || (NAN(fVar30))) || (fVar30 = (ctx->input).mouse.delta.y, fVar30 != 0.0))
       || (NAN(fVar30))) {
      bVar29 = false;
    }
    else {
      bVar29 = (ctx->input).mouse.scroll_delta == 0.0;
    }
    iVar19 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar29 & iVar19 != 0)) && (iVar19 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_00129da8;
    pnVar9->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar9->scrollbar_hiding_timer;
  }
  uVar6 = pnVar10->flags;
  if ((uVar6 & 1) != 0) {
    nVar7 = pnVar10->type;
    lVar21 = 0x1e1c;
    if ((int)nVar7 < 0x20) {
      if (nVar7 == NK_PANEL_GROUP) {
        lVar21 = 0x1e30;
      }
      else if (nVar7 == NK_PANEL_POPUP) {
        lVar21 = 0x1e20;
      }
      else if (nVar7 == NK_PANEL_CONTEXTUAL) {
        lVar21 = 0x1e28;
      }
    }
    else if (nVar7 == NK_PANEL_COMBO) {
      lVar21 = 0x1e24;
    }
    else if ((nVar7 == NK_PANEL_MENU) || (nVar7 == NK_PANEL_TOOLTIP)) {
      lVar21 = 0x1e2c;
    }
    if ((uVar6 >> 0xe & 1) == 0) {
      if ((uVar6 >> 10 & 1) == 0) {
        fVar30 = (pnVar9->bounds).y + (pnVar9->bounds).h;
      }
      else {
        fVar30 = (pnVar10->bounds).y + (pnVar10->bounds).h + pnVar10->footer_height;
      }
    }
    else {
      fVar30 = (ctx->style).window.border + (pnVar9->bounds).y + pnVar10->header_height;
    }
    local_e8._0_4_ = fVar30;
    uVar8 = *(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar21);
    fVar30 = (pnVar9->bounds).x;
    fVar32 = (pnVar9->bounds).y;
    fVar33 = (pnVar9->bounds).w;
    fVar31 = pnVar10->border;
    pvVar22 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar22 != (void *)0x0) {
      *(short *)((long)pvVar22 + 0x10) = (short)(int)fVar31;
      *(short *)((long)pvVar22 + 0x12) = (short)(int)fVar30;
      uVar24 = (undefined2)(int)fVar32;
      *(undefined2 *)((long)pvVar22 + 0x14) = uVar24;
      *(short *)((long)pvVar22 + 0x16) = (short)(int)(fVar33 + fVar30);
      *(undefined2 *)((long)pvVar22 + 0x18) = uVar24;
      *(undefined4 *)((long)pvVar22 + 0x1a) = uVar8;
    }
    fVar30 = (pnVar9->bounds).x;
    fVar32 = (pnVar9->bounds).w;
    fVar33 = pnVar10->border;
    pvVar22 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar22 != (void *)0x0) {
      *(short *)((long)pvVar22 + 0x10) = (short)(int)fVar33;
      *(short *)((long)pvVar22 + 0x12) = (short)(int)fVar30;
      *(short *)((long)pvVar22 + 0x14) = (short)(int)(float)local_e8._0_4_;
      *(short *)((long)pvVar22 + 0x16) = (short)(int)(fVar32 + fVar30);
      *(short *)((long)pvVar22 + 0x18) = (short)(int)(float)local_e8._0_4_;
      *(undefined4 *)((long)pvVar22 + 0x1a) = uVar8;
    }
    fVar30 = (pnVar9->bounds).x;
    fVar32 = (pnVar9->bounds).y;
    fVar33 = pnVar10->border;
    pvVar22 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar22 != (void *)0x0) {
      *(short *)((long)pvVar22 + 0x10) = (short)(int)fVar33;
      uVar24 = (undefined2)(int)(fVar33 * 0.5 + fVar30);
      *(undefined2 *)((long)pvVar22 + 0x12) = uVar24;
      *(short *)((long)pvVar22 + 0x14) = (short)(int)fVar32;
      *(undefined2 *)((long)pvVar22 + 0x16) = uVar24;
      *(short *)((long)pvVar22 + 0x18) = (short)(int)(float)local_e8._0_4_;
      *(undefined4 *)((long)pvVar22 + 0x1a) = uVar8;
    }
    fVar30 = (pnVar9->bounds).x;
    fVar32 = (pnVar9->bounds).y;
    fVar33 = (pnVar9->bounds).w;
    fVar31 = pnVar10->border;
    pvVar22 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar22 != (void *)0x0) {
      *(short *)((long)pvVar22 + 0x10) = (short)(int)fVar31;
      uVar24 = (undefined2)(int)(fVar31 * -0.5 + fVar30 + fVar33);
      *(undefined2 *)((long)pvVar22 + 0x12) = uVar24;
      *(short *)((long)pvVar22 + 0x14) = (short)(int)fVar32;
      *(undefined2 *)((long)pvVar22 + 0x16) = uVar24;
      *(short *)((long)pvVar22 + 0x18) = (short)(int)(float)local_e8._0_4_;
      *(undefined4 *)((long)pvVar22 + 0x1a) = uVar8;
    }
  }
  if (((pnVar10->flags & 0x4004) == 4) && (in != (nk_context *)0x0)) {
    fVar30 = (pnVar10->bounds).y + (pnVar10->bounds).h;
    local_c8._0_4_ = (pnVar10->bounds).x + (pnVar10->bounds).w + (float)local_c8._0_4_;
    if ((pnVar10->flags & 0x20) != 0) {
      local_c8._0_4_ = (float)local_c8._0_4_ - (float)local_d8._0_4_;
    }
    local_c8._4_4_ = fVar30;
    local_c8._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar30;
      r_00.x = (float)local_c8._0_4_;
      r_00.h = (float)local_b8._0_4_;
      r_00.w = (float)local_d8._0_4_;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      nk_fill_triangle(b,(float)local_d8._0_4_ + (float)local_c8._0_4_,fVar30,
                       (float)local_d8._0_4_ + (float)local_c8._0_4_,fVar30 + (float)local_b8._0_4_,
                       (float)local_c8._0_4_,fVar30 + (float)local_b8._0_4_,
                       (ctx->style).window.scaler.data.color);
    }
    if ((pnVar9->flags & 0x800) == 0) {
      iVar19 = (in->input).mouse.buttons[0].down;
      fVar30 = (in->input).mouse.buttons[0].clicked_pos.x;
      bVar29 = false;
      if (((float)local_c8._0_4_ <= fVar30) &&
         (bVar29 = false, fVar30 <= (float)local_d8._0_4_ + (float)local_c8._0_4_)) {
        fVar30 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar29 = iVar19 == 1 &&
                 (fVar30 <= (float)local_b8._0_4_ + (float)local_c8._4_4_ &&
                 (float)local_c8._4_4_ <= fVar30);
      }
      if ((iVar19 != 0) && (bVar29)) {
        fVar30 = (in->input).mouse.delta.x;
        fVar33 = (pnVar9->bounds).w + fVar30;
        fVar32 = (ctx->style).window.min_size.x;
        if (fVar33 <= fVar32) {
          fVar33 = fVar32;
        }
        fVar32 = (ctx->style).window.min_size.y;
        (pnVar9->bounds).w = fVar33;
        if ((pnVar10->flags & 0x400) == 0) {
          fVar33 = (pnVar9->bounds).h + (in->input).mouse.delta.y;
          if (fVar33 <= fVar32) {
            fVar33 = fVar32;
          }
          (pnVar9->bounds).h = fVar33;
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        (in->input).mouse.buttons[0].clicked_pos.x =
             (float)local_d8._0_4_ * 0.5 + fVar30 + (float)local_c8._0_4_;
        (in->input).mouse.buttons[0].clicked_pos.y =
             (float)local_b8._0_4_ * 0.5 + (float)local_c8._4_4_ + (in->input).mouse.delta.y;
      }
    }
  }
  if ((pnVar10->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((pnVar10->flags & 0x1000) == 0) {
      (pnVar9->buffer).end = (ctx->memory).allocated;
      pnVar20 = pnVar9->layout;
      if ((pnVar20->popup_buffer).active != 0) {
        pvVar22 = (ctx->memory).memory.ptr;
        nVar13 = (pnVar20->popup_buffer).last;
        nVar14 = (pnVar9->buffer).last;
        nVar15 = (pnVar20->popup_buffer).end;
        *(nk_size *)((long)pvVar22 + (pnVar20->popup_buffer).parent + 8) = nVar15;
        *(undefined8 *)((long)pvVar22 + nVar13 + 8) = *(undefined8 *)((long)pvVar22 + nVar14 + 8);
        *(nk_size *)((long)pvVar22 + nVar14 + 8) = (pnVar20->popup_buffer).begin;
        (pnVar9->buffer).last = nVar13;
        (pnVar9->buffer).end = nVar15;
        (pnVar20->popup_buffer).active = 0;
      }
    }
    else {
      (pnVar9->buffer).begin = 0;
      (pnVar9->buffer).end = 0;
      (pnVar9->buffer).last = 0;
      (pnVar9->buffer).clip = nk_null_rect;
    }
  }
  if ((short)pnVar10->flags < 0) {
    pnVar10->flags = pnVar10->flags & 0xffff77ff;
  }
  pnVar9->flags = pnVar10->flags;
  iVar19 = (pnVar9->property).active;
  if (((iVar19 == 0) || ((pnVar9->property).old == (pnVar9->property).seq)) ||
     (iVar19 != (pnVar9->property).prev)) {
    (pnVar9->property).old = (pnVar9->property).seq;
    (pnVar9->property).prev = iVar19;
    (pnVar9->property).seq = 0;
  }
  else {
    __s = &pnVar9->property;
    uVar27 = (ulong)__s & 3;
    if (uVar27 == 0) {
      uVar28 = 0x60;
    }
    else {
      memset(__s,0,4 - uVar27);
      uVar28 = uVar27 | 0x5c;
      __s = (nk_property_state *)((long)__s + (4 - uVar27));
    }
    uVar27 = (ulong)((uint)uVar28 & 0xfffffffc);
    memset(__s,0,uVar27);
    if ((uVar28 & 3) != 0) {
      memset(__s->buffer + (uVar27 - 8),0,uVar28 & 3);
    }
  }
  iVar19 = (pnVar9->edit).active;
  if (((iVar19 == 0) || ((pnVar9->edit).old == (pnVar9->edit).seq)) ||
     (iVar19 != (pnVar9->edit).prev)) {
    (pnVar9->edit).old = (pnVar9->edit).seq;
    (pnVar9->edit).prev = iVar19;
    (pnVar9->edit).seq = 0;
  }
  else {
    __s_00 = &pnVar9->edit;
    uVar27 = (ulong)__s_00 & 3;
    if (uVar27 == 0) {
      uVar28 = 0x2c;
    }
    else {
      memset(__s_00,0,4 - uVar27);
      uVar28 = uVar27 | 0x28;
      __s_00 = (nk_edit_state *)((long)__s_00 + (4 - uVar27));
    }
    uVar27 = (ulong)((uint)uVar28 & 0xfffffffc);
    memset(__s_00,0,uVar27);
    if ((uVar28 & 3) != 0) {
      memset((void *)((long)&__s_00->name + uVar27),0,uVar28 & 3);
    }
  }
  if (((pnVar9->popup).active_con == 0) || ((pnVar9->popup).con_old == (pnVar9->popup).con_count)) {
    puVar23 = &(pnVar9->popup).con_count;
    (pnVar9->popup).con_old = (pnVar9->popup).con_count;
  }
  else {
    puVar23 = &(pnVar9->popup).active_con;
    (pnVar9->popup).con_count = 0;
    (pnVar9->popup).con_old = 0;
  }
  *puVar23 = 0;
  (pnVar9->popup).combo_count = 0;
  if ((pnVar10->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x41f2,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012a48b:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);

    layout = ctx->current->layout;
    if (!ctx || !ctx->current) return;
    if (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN)) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}